

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O2

Orphan<capnp::schema::Brand> * __thiscall
capnp::Orphanage::newOrphan<capnp::schema::Brand>
          (Orphan<capnp::schema::Brand> *__return_storage_ptr__,Orphanage *this)

{
  OrphanBuilder local_30;
  
  capnp::_::OrphanBuilder::initStruct(&local_30,this->arena,this->capTable,(StructSize)0x10000);
  (__return_storage_ptr__->builder).segment = local_30.segment;
  (__return_storage_ptr__->builder).capTable = local_30.capTable;
  (__return_storage_ptr__->builder).location = local_30.location;
  local_30.segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).tag.content = local_30.tag.content;
  local_30.location = (word *)0x0;
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Orphan<RootType> Orphanage::newOrphan() const {
  return Orphan<RootType>(_::OrphanBuilder::initStruct(arena, capTable, _::structSize<RootType>()));
}